

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum.cpp
# Opt level: O0

int icu_63::double_conversion::Bignum::PlusCompare(Bignum *a,Bignum *b,Bignum *c)

{
  int iVar1;
  int iVar2;
  Chunk CVar3;
  Chunk CVar4;
  Chunk CVar5;
  uint uVar6;
  Chunk sum;
  Chunk chunk_c;
  Chunk chunk_b;
  Chunk chunk_a;
  int i;
  int min_exponent;
  Chunk borrow;
  Bignum *c_local;
  Bignum *b_local;
  Bignum *a_local;
  
  iVar1 = BigitLength(a);
  iVar2 = BigitLength(b);
  if (iVar1 < iVar2) {
    a_local._4_4_ = PlusCompare(b,a,c);
  }
  else {
    iVar1 = BigitLength(a);
    iVar2 = BigitLength(c);
    if (iVar1 + 1 < iVar2) {
      a_local._4_4_ = -1;
    }
    else {
      iVar1 = BigitLength(a);
      iVar2 = BigitLength(c);
      if (iVar2 < iVar1) {
        a_local._4_4_ = 1;
      }
      else {
        iVar1 = a->exponent_;
        iVar2 = BigitLength(b);
        if (iVar2 <= iVar1) {
          iVar1 = BigitLength(a);
          iVar2 = BigitLength(c);
          if (iVar1 < iVar2) {
            return -1;
          }
        }
        i = 0;
        iVar1 = Min<int>(a->exponent_,b->exponent_);
        iVar1 = Min<int>(iVar1,c->exponent_);
        chunk_b = BigitLength(c);
        while (chunk_b = chunk_b - 1, iVar1 <= (int)chunk_b) {
          CVar3 = BigitAt(a,chunk_b);
          CVar4 = BigitAt(b,chunk_b);
          CVar5 = BigitAt(c,chunk_b);
          if (CVar5 + i < CVar3 + CVar4) {
            return 1;
          }
          uVar6 = (CVar5 + i) - (CVar3 + CVar4);
          if (1 < uVar6) {
            return -1;
          }
          i = uVar6 * 0x10000000;
        }
        if (i == 0) {
          a_local._4_4_ = 0;
        }
        else {
          a_local._4_4_ = -1;
        }
      }
    }
  }
  return a_local._4_4_;
}

Assistant:

int Bignum::PlusCompare(const Bignum& a, const Bignum& b, const Bignum& c) {
  ASSERT(a.IsClamped());
  ASSERT(b.IsClamped());
  ASSERT(c.IsClamped());
  if (a.BigitLength() < b.BigitLength()) {
    return PlusCompare(b, a, c);
  }
  if (a.BigitLength() + 1 < c.BigitLength()) return -1;
  if (a.BigitLength() > c.BigitLength()) return +1;
  // The exponent encodes 0-bigits. So if there are more 0-digits in 'a' than
  // 'b' has digits, then the bigit-length of 'a'+'b' must be equal to the one
  // of 'a'.
  if (a.exponent_ >= b.BigitLength() && a.BigitLength() < c.BigitLength()) {
    return -1;
  }

  Chunk borrow = 0;
  // Starting at min_exponent all digits are == 0. So no need to compare them.
  int min_exponent = Min(Min(a.exponent_, b.exponent_), c.exponent_);
  for (int i = c.BigitLength() - 1; i >= min_exponent; --i) {
    Chunk chunk_a = a.BigitAt(i);
    Chunk chunk_b = b.BigitAt(i);
    Chunk chunk_c = c.BigitAt(i);
    Chunk sum = chunk_a + chunk_b;
    if (sum > chunk_c + borrow) {
      return +1;
    } else {
      borrow = chunk_c + borrow - sum;
      if (borrow > 1) return -1;
      borrow <<= kBigitSize;
    }
  }
  if (borrow == 0) return 0;
  return -1;
}